

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void __thiscall
ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::reallocate
          (ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> *this,size_t size)

{
  Ref *pRVar1;
  size_t sVar2;
  Ref *pRVar3;
  size_t sVar4;
  
  pRVar1 = this->data;
  this->allocatedElements = size;
  pRVar3 = (Ref *)MixedArena::allocSpace((MixedArena *)cashew::arena,size << 3,8);
  this->data = pRVar3;
  sVar2 = this->usedElements;
  if (sVar2 != 0) {
    sVar4 = 0;
    do {
      this->data[sVar4].inst = pRVar1[sVar4].inst;
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return;
}

Assistant:

void reallocate(size_t size) {
    T* old = data;
    static_cast<SubType*>(this)->allocate(size);
    for (size_t i = 0; i < usedElements; i++) {
      data[i] = old[i];
    }
  }